

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

void fully_identify_obj(obj *otmp)

{
  discover_object((int)otmp->otyp,'\x01','\x01');
  if (otmp->oartifact != '\0') {
    discover_artifact(otmp->oartifact);
  }
  otmp->field_0x4a = otmp->field_0x4a | 0xf0;
  otmp->oprops_known = 0xfffff;
  if ((otmp->otyp == 0x10f) && (otmp->corpsenm != -1)) {
    learn_egg_type(otmp->corpsenm);
    return;
  }
  return;
}

Assistant:

void fully_identify_obj(struct obj *otmp)
{
    makeknown(otmp->otyp);
    if (otmp->oartifact) discover_artifact((xchar)otmp->oartifact);
    otmp->known = otmp->dknown = otmp->bknown = otmp->rknown = 1;
    otmp->oprops_known = ITEM_PROP_MASK;
    if (otmp->otyp == EGG && otmp->corpsenm != NON_PM)
	learn_egg_type(otmp->corpsenm);
}